

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbift3.cpp
# Opt level: O1

void CVmBifT3::get_source_info(uchar *entry_addr,ulong method_ofs,vm_val_t *retval)

{
  CVmObjPageEntry *this;
  char *input_str;
  anon_union_8_8_cb74652f_for_val aVar1;
  undefined4 uVar2;
  vm_val_t *pvVar3;
  int iVar4;
  vm_obj_id_t vVar5;
  size_t byte_size;
  ulong uVar6;
  CVmSrcfEntry *pCVar7;
  CVmDbgLinePtr line_ptr;
  uchar *stm_end;
  uchar *stm_start;
  CVmFuncPtr func_ptr;
  vm_val_t ele;
  CVmDbgLinePtr local_60;
  uchar *local_58;
  uchar *local_50;
  CVmFuncPtr local_48;
  vm_val_t local_40;
  
  retval->typ = VM_NIL;
  local_48.p_ = entry_addr;
  iVar4 = CVmRun::get_stm_bounds(&local_48,method_ofs,&local_60,&local_50,&local_58);
  if (iVar4 != 0) {
    if ((G_srcf_table_X == (CVmSrcfTable *)0x0) ||
       (G_srcf_table_X->list_used_ <= (ulong)*(ushort *)(local_60.p_ + 2))) {
      pCVar7 = (CVmSrcfEntry *)0x0;
    }
    else {
      pCVar7 = G_srcf_table_X->list_[*(ushort *)(local_60.p_ + 2)];
    }
    if (pCVar7 != (CVmSrcfEntry *)0x0) {
      vVar5 = CVmObjList::create(0,2);
      retval->typ = VM_OBJ;
      (retval->val).obj = vVar5;
      this = G_obj_table_X.pages_[vVar5 >> 0xc] + (vVar5 & 0xfff);
      uVar6 = (ulong)**(ushort **)((long)&this->ptr_ + 8);
      if (uVar6 != 0) {
        CVmObjList::cons_clear((CVmObjList *)this,0,uVar6 - 1);
      }
      pvVar3 = sp_;
      uVar2 = *(undefined4 *)&retval->field_0x4;
      aVar1 = retval->val;
      sp_ = sp_ + 1;
      pvVar3->typ = retval->typ;
      *(undefined4 *)&pvVar3->field_0x4 = uVar2;
      pvVar3->val = aVar1;
      input_str = pCVar7->name_buf_;
      byte_size = CCharmapToUni::map_str(G_cmap_from_fname_X,(char *)0x0,0,input_str);
      local_40.val.obj = CVmObjString::create(0,byte_size);
      local_40.typ = VM_OBJ;
      CVmObjList::cons_set_element((CVmObjList *)this,0,&local_40);
      CCharmapToUni::map_str
                (G_cmap_from_fname_X,
                 (char *)(*(long *)((long)&G_obj_table_X.pages_[local_40.val.obj >> 0xc]
                                           [local_40.val.obj & 0xfff].ptr_ + 8) + 2),byte_size,
                 input_str);
      local_40.val.obj = *(undefined4 *)(local_60.p_ + 4);
      local_40.typ = VM_INT;
      CVmObjList::cons_set_element((CVmObjList *)this,1,&local_40);
      sp_ = sp_ + -1;
    }
  }
  return;
}

Assistant:

void CVmBifT3::get_source_info(VMG_ const uchar *entry_addr, ulong method_ofs,
                               vm_val_t *retval)
{
    CVmFuncPtr func_ptr;
    CVmDbgLinePtr line_ptr;
    const uchar *stm_start, *stm_end;
    CVmObjList *lst;
    vm_val_t ele;
    CVmSrcfEntry *srcf;
    CVmObjString *str;
    const char *fname;
    size_t map_len;

    /* presume we won't be able to find source information for the location */
    retval->set_nil();

    /* set up a debug table pointer for the function or method */
    func_ptr.set(entry_addr);

    /* get the debug information for the given location */
    if (!CVmRun::get_stm_bounds(vmg_ &func_ptr, method_ofs,
                                &line_ptr, &stm_start, &stm_end))
    {
        /* no source information available - return failure */
        return;
    }

    /* get the source file record - if we can't find it, return failure */
    srcf = (G_srcf_table != 0
            ? G_srcf_table->get_entry(line_ptr.get_source_id()) : 0);
    if (srcf == 0)
        return;

    /* 
     *   Create a list for the return value.  The return list has two
     *   elements: the name of the source file containing this code, and the
     *   line number in the file. 
     */
    retval->set_obj(CVmObjList::create(vmg_ FALSE, 2));
    lst = (CVmObjList *)vm_objp(vmg_ retval->val.obj);

    /* clear the list, in case gc runs during construction */
    lst->cons_clear();

    /* push the list for gc protection */
    G_stk->push(retval);

    /* get the filename string */
    fname = srcf->get_name();

    /* 
     *   determine how long the string will be when translated to utf8 from
     *   the local filename character set 
     */
    map_len = G_cmap_from_fname->map_str(0, 0, fname);

    /* 
     *   create a string value to hold the filename, and store it in the
     *   first element of the return list (note that this automatically
     *   protects the new string from garbage collection, by virtue of the
     *   list referencing the string and the list itself being protected) 
     */
    ele.set_obj(CVmObjString::create(vmg_ FALSE, map_len));
    lst->cons_set_element(0, &ele);

    /* map the string into the buffer we allocated for it */
    str = (CVmObjString *)vm_objp(vmg_ ele.val.obj);
    G_cmap_from_fname->map_str(str->cons_get_buf(), map_len, fname);

    /* set the second element of the list to the source line number */
    ele.set_int(line_ptr.get_source_line());
    lst->cons_set_element(1, &ele);

    /* discard our gc protection */
    G_stk->discard();
}